

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

LY_ERR lyd_validate_new(lyd_node **first,lysc_node *sparent,lys_module *mod,lysc_ext_instance *ext,
                       uint32_t val_opts,uint32_t int_opts,ly_ht *getnext_ht,lyd_node **diff)

{
  ushort uVar1;
  lysc_node *plVar2;
  ly_ht *ht;
  ly_ctx *ctx;
  ly_ctx *plVar3;
  lys_module *plVar4;
  ly_bool lVar5;
  byte bVar6;
  LY_ERR LVar7;
  LY_ERR LVar8;
  lys_module *plVar9;
  lysc_node *plVar10;
  lyd_node *plVar11;
  uint uVar12;
  bool bVar13;
  lysc_node *local_48;
  lys_module *local_40;
  lyd_node *node;
  
  if ((first == (lyd_node **)0x0) || (sparent == (lysc_node *)0x0 && mod == (lys_module *)0x0)) {
    __assert_fail("first && (sparent || mod)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x3af,
                  "LY_ERR lyd_validate_new(struct lyd_node **, const struct lysc_node *, const struct lys_module *, const struct lysc_ext_instance *, uint32_t, uint32_t, struct ly_ht *, struct lyd_node **)"
                 );
  }
  LVar7 = lyd_validate_choice_r(first,sparent,mod,ext,val_opts,int_opts,getnext_ht,diff);
  if (((LVar7 != LY_SUCCESS) &&
      ((LVar8 = LVar7, LVar7 != LY_EVALID || (LVar8 = LY_EVALID, (val_opts & 4) == 0)))) ||
     (node = *first, LVar8 = LVar7, node == (lyd_node *)0x0)) {
    return LVar8;
  }
  local_40 = (lys_module *)0x0;
LAB_001b4a0a:
  if (node->schema == (lysc_node *)0x0) {
    return LVar7;
  }
  if ((mod != (lys_module *)0x0) && (plVar9 = lyd_owner_module(node), plVar9 != mod)) {
    return LVar7;
  }
  uVar12 = node->flags;
  if ((uVar12 & 5) != 0) {
    plVar9 = (lys_module *)node->schema;
    uVar1 = *(ushort *)&plVar9->ctx;
    plVar4 = local_40;
    if (uVar1 == 1) {
      bVar13 = (bool)(*(byte *)((long)&plVar9->ctx + 2) >> 7);
LAB_001b4a94:
      if ((plVar9 != local_40 && bVar13 == false) && ((uVar12 & 4) != 0)) {
        if (uVar1 == 8) {
LAB_001b4ab4:
          lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_48);
          plVar10 = local_48;
          while( true ) {
            plVar4 = plVar9;
            if ((plVar10 == (lysc_node *)0x0) || (plVar10->module != plVar9)) goto LAB_001b4ca0;
            if ((*(uint32_t *)plVar10->hash & 1) == 0) break;
            plVar10 = plVar10->next;
          }
          local_48 = (lysc_node *)0x0;
          lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_48);
          if (local_48 != (lysc_node *)0x0) {
            uVar12 = 0;
            goto LAB_001b4b96;
          }
        }
        else {
          if ((uVar1 & 5) == 0) {
            __assert_fail("schema->nodetype & (LYS_LEAF | LYS_CONTAINER)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                          ,800,
                          "ly_bool lyd_validate_autodel_cont_leaf_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                         );
          }
          lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_48);
          for (; (local_48 != (lysc_node *)0x0 && (local_48->module == plVar9));
              local_48 = local_48->next) {
            if ((*(uint32_t *)local_48->hash & 1) == 0) {
              local_48 = (lysc_node *)0x0;
              lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_48);
              plVar4 = plVar9;
              if (local_48 == (lysc_node *)0x0) goto LAB_001b4ca0;
              uVar12 = 0;
              goto LAB_001b4c1d;
            }
          }
          lyd_find_sibling_val(*first,(lysc_node *)plVar9,(char *)0x0,0,(lyd_node **)&local_48);
          for (; (plVar4 = plVar9, local_48 != (lysc_node *)0x0 && (local_48->module == plVar9));
              local_48 = local_48->next) {
            if ((*(uint *)local_48->hash & 5) == 1) {
              bVar6 = lyd_validate_autodel_node_del
                                (first,(lyd_node *)local_48,mod,0,&node,(ly_set *)0x0,(ly_set *)0x0,
                                 diff);
              uVar12 = (uint)bVar6;
              goto LAB_001b4c93;
            }
          }
        }
      }
    }
    else if (uVar1 == 8) {
      if (((plVar9->deviated_by != (lys_module **)0x0) && (plVar9 != local_40)) &&
         ((uVar12 & 4) != 0)) goto LAB_001b4ab4;
    }
    else if (uVar1 == 4) {
      bVar13 = plVar9->deviated_by == (lys_module **)0x0;
      goto LAB_001b4a94;
    }
    goto LAB_001b4ca0;
  }
  node = node->next;
  goto LAB_001b4a3d;
  while( true ) {
    plVar10 = local_48->next;
    if ((*(uint32_t *)local_48->hash & 1) != 0) {
      local_40 = (lys_module *)CONCAT44(local_40._4_4_,uVar12);
      lVar5 = lyd_validate_autodel_node_del
                        (first,(lyd_node *)local_48,mod,0,&node,(ly_set *)0x0,(ly_set *)0x0,diff);
      uVar12 = (uint)local_40 & 0xff;
      if (lVar5 != '\0') {
        uVar12 = 1;
      }
    }
    local_48 = plVar10;
    if (plVar10 == (lysc_node *)0x0) break;
LAB_001b4c1d:
    if (local_48->module != plVar9) break;
  }
  goto LAB_001b4c93;
  while( true ) {
    plVar10 = local_48->next;
    if ((*(uint32_t *)local_48->hash & 1) != 0) {
      local_40 = (lys_module *)CONCAT44(local_40._4_4_,uVar12);
      lVar5 = lyd_validate_autodel_node_del
                        (first,(lyd_node *)local_48,mod,0,&node,(ly_set *)0x0,(ly_set *)0x0,diff);
      uVar12 = (uint)local_40 & 0xff;
      if (lVar5 != '\0') {
        uVar12 = 1;
      }
    }
    local_48 = plVar10;
    if (plVar10 == (lysc_node *)0x0) break;
LAB_001b4b96:
    if (local_48->module != plVar9) break;
  }
LAB_001b4c93:
  local_40 = plVar9;
  plVar4 = plVar9;
  if ((char)uVar12 != '\0') goto LAB_001b4a3d;
LAB_001b4ca0:
  local_40 = plVar4;
  plVar10 = (lysc_node *)node;
  uVar12 = node->flags;
  if ((uVar12 & 4) != 0) {
    plVar11 = *first;
    local_48 = (lysc_node *)node;
    plVar2 = node->schema;
    if (plVar2 == (lysc_node *)0x0) {
LAB_001b4ce3:
      if ((node->parent == (lyd_node_inner *)0x0) ||
         (ht = node->parent->children_ht, ht == (ly_ht *)0x0)) {
        for (; plVar11 != (lyd_node *)0x0; plVar11 = plVar11->next) {
          if ((lysc_node *)plVar11 != plVar10) {
            if ((((lyd_node *)plVar10)->schema->nodetype & 100) == 0) {
              LVar8 = lyd_compare_single(plVar11,(lyd_node *)plVar10,0);
              if (LVar8 == LY_SUCCESS) goto LAB_001b4d4f;
            }
            else if (plVar11->schema == ((lyd_node *)plVar10)->schema) goto LAB_001b4d4f;
          }
        }
      }
      else {
        LVar8 = lyht_find_next_with_collision_cb
                          (ht,&local_48,node->hash,lyd_val_dup_val_equal,(void **)0x0);
        plVar10 = local_48;
        if (LVar8 == LY_SUCCESS) {
LAB_001b4d4f:
          plVar3 = plVar10->module->ctx;
          ly_log_location((lysc_node *)0x0,(lyd_node *)plVar10,(char *)0x0,(ly_in *)0x0);
          ctx = ((lys_module *)local_48->module->name)->ctx;
          if (((val_opts & 8) == 0) || (((ulong)plVar3 & 0x18) == 0)) {
            ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Duplicate instance of \"%s\".");
            ly_log_location_revert(0,1,0,0);
            LVar7 = LY_EVALID;
            if ((val_opts & 4) == 0) {
              return LY_EVALID;
            }
          }
          else {
            ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Duplicate instance of \"%s\".");
            ly_log_location_revert(0,1,0,0);
          }
        }
      }
    }
    else if (plVar2->nodetype == 8) {
      if ((plVar2->flags & 1) != 0) goto LAB_001b4ce3;
    }
    else if ((plVar2->nodetype != 0x10) || ((plVar2->flags & 0x200) == 0)) goto LAB_001b4ce3;
    uVar12 = node->flags & 0xfffffffb;
    node->flags = uVar12;
  }
  if ((uVar12 & 1) != 0) {
    local_48 = (lysc_node *)0x0;
    plVar10 = node->schema;
    plVar2 = plVar10->parent;
    if ((plVar2 != (lysc_node *)0x0) && (plVar2->nodetype == 0x80)) {
      if (plVar2->parent->nodetype != 2) {
        __assert_fail("choic->nodetype == LYS_CHOICE",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                      ,0x362,
                      "ly_bool lyd_validate_autodel_case_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                     );
      }
      if (plVar2->parent[1].parent != plVar2) {
        plVar11 = (lyd_node *)0x0;
        do {
          plVar11 = lys_getnext_data(plVar11,*first,&local_48,plVar10->parent,(lysc_module *)0x0);
          if (plVar11 == (lyd_node *)0x0) {
            lVar5 = lyd_validate_autodel_node_del
                              (first,node,mod,0,&node,(ly_set *)0x0,(ly_set *)0x0,diff);
            if (lVar5 != '\0') goto LAB_001b4a3d;
            break;
          }
        } while ((plVar11->flags & 1) != 0);
      }
    }
  }
  node = node->next;
LAB_001b4a3d:
  if (node == (lyd_node *)0x0) {
    return LVar7;
  }
  goto LAB_001b4a0a;
}

Assistant:

LY_ERR
lyd_validate_new(struct lyd_node **first, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_ext_instance *ext, uint32_t val_opts, uint32_t int_opts, struct ly_ht *getnext_ht,
        struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_node *node;
    const struct lysc_node *last_dflt_schema = NULL;

    assert(first && (sparent || mod));

    /* validate choices */
    r = lyd_validate_choice_r(first, sparent, mod, ext, val_opts, int_opts, getnext_ht, diff);
    LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

    node = *first;
    while (node) {
        if (!node->schema || (mod && (lyd_owner_module(node) != mod))) {
            /* opaque node or all top-level data from this module checked */
            break;
        }

        if (!(node->flags & (LYD_NEW | LYD_DEFAULT))) {
            /* check only new and default nodes */
            node = node->next;
            continue;
        }

        if (lyd_val_has_default(node->schema) && (node->schema != last_dflt_schema) && (node->flags & LYD_NEW)) {
            /* remove old default(s) of the new node if an explicit instance exists */
            last_dflt_schema = node->schema;
            if (node->schema->nodetype == LYS_LEAFLIST) {
                if (lyd_validate_autodel_leaflist_dflt(first, &node, mod, diff)) {
                    continue;
                }
            } else {
                if (lyd_validate_autodel_cont_leaf_dflt(first, &node, mod, diff)) {
                    continue;
                }
            }
        }

        if (node->flags & LYD_NEW) {
            /* then check new node instance duplicities */
            r = lyd_validate_duplicates(*first, node, val_opts);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* this node is valid */
            node->flags &= ~LYD_NEW;
        }

        if (node->flags & LYD_DEFAULT) {
            /* remove leftover default nodes from a no-longer existing case */
            if (lyd_validate_autodel_case_dflt(first, &node, mod, diff)) {
                continue;
            }
        }

        /* next iter */
        node = node->next;
    }

cleanup:
    return rc;
}